

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O2

void helper_msa_add_a_h_mips64(CPUMIPSState_conflict5 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  fpr_t *pfVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  
  pfVar1 = (env->active_fpu).fpr + ws;
  sVar18 = *(short *)pfVar1;
  sVar19 = *(short *)((long)pfVar1 + 2);
  sVar20 = *(short *)((long)pfVar1 + 4);
  sVar21 = *(short *)((long)pfVar1 + 6);
  sVar22 = *(short *)((long)pfVar1 + 8);
  sVar23 = *(short *)((long)pfVar1 + 10);
  sVar24 = *(short *)((long)pfVar1 + 0xc);
  sVar25 = *(short *)((long)pfVar1 + 0xe);
  pfVar1 = (env->active_fpu).fpr + wt;
  sVar26 = *(short *)pfVar1;
  sVar27 = *(short *)((long)pfVar1 + 2);
  sVar28 = *(short *)((long)pfVar1 + 4);
  sVar29 = *(short *)((long)pfVar1 + 6);
  sVar30 = *(short *)((long)pfVar1 + 8);
  sVar31 = *(short *)((long)pfVar1 + 10);
  sVar32 = *(short *)((long)pfVar1 + 0xc);
  sVar33 = *(short *)((long)pfVar1 + 0xe);
  sVar2 = -sVar18;
  sVar3 = -sVar19;
  sVar4 = -sVar20;
  sVar5 = -sVar21;
  sVar6 = -sVar22;
  sVar7 = -sVar23;
  sVar8 = -sVar24;
  sVar9 = -sVar25;
  sVar10 = -sVar26;
  sVar11 = -sVar27;
  sVar12 = -sVar28;
  sVar13 = -sVar29;
  sVar14 = -sVar30;
  sVar15 = -sVar31;
  sVar16 = -sVar32;
  sVar17 = -sVar33;
  pfVar1 = (env->active_fpu).fpr + wd;
  *(ushort *)pfVar1 =
       ((ushort)(sVar10 < sVar26) * sVar26 | (ushort)(sVar10 >= sVar26) * sVar10) +
       ((ushort)(sVar2 < sVar18) * sVar18 | (ushort)(sVar2 >= sVar18) * sVar2);
  *(ushort *)((long)pfVar1 + 2) =
       ((ushort)(sVar11 < sVar27) * sVar27 | (ushort)(sVar11 >= sVar27) * sVar11) +
       ((ushort)(sVar3 < sVar19) * sVar19 | (ushort)(sVar3 >= sVar19) * sVar3);
  *(ushort *)((long)pfVar1 + 4) =
       ((ushort)(sVar12 < sVar28) * sVar28 | (ushort)(sVar12 >= sVar28) * sVar12) +
       ((ushort)(sVar4 < sVar20) * sVar20 | (ushort)(sVar4 >= sVar20) * sVar4);
  *(ushort *)((long)pfVar1 + 6) =
       ((ushort)(sVar13 < sVar29) * sVar29 | (ushort)(sVar13 >= sVar29) * sVar13) +
       ((ushort)(sVar5 < sVar21) * sVar21 | (ushort)(sVar5 >= sVar21) * sVar5);
  *(ushort *)((long)pfVar1 + 8) =
       ((ushort)(sVar14 < sVar30) * sVar30 | (ushort)(sVar14 >= sVar30) * sVar14) +
       ((ushort)(sVar6 < sVar22) * sVar22 | (ushort)(sVar6 >= sVar22) * sVar6);
  *(ushort *)((long)pfVar1 + 10) =
       ((ushort)(sVar15 < sVar31) * sVar31 | (ushort)(sVar15 >= sVar31) * sVar15) +
       ((ushort)(sVar7 < sVar23) * sVar23 | (ushort)(sVar7 >= sVar23) * sVar7);
  *(ushort *)((long)pfVar1 + 0xc) =
       ((ushort)(sVar16 < sVar32) * sVar32 | (ushort)(sVar16 >= sVar32) * sVar16) +
       ((ushort)(sVar8 < sVar24) * sVar24 | (ushort)(sVar8 >= sVar24) * sVar8);
  *(ushort *)((long)pfVar1 + 0xe) =
       ((ushort)(sVar17 < sVar33) * sVar33 | (ushort)(sVar17 >= sVar33) * sVar17) +
       ((ushort)(sVar9 < sVar25) * sVar25 | (ushort)(sVar9 >= sVar25) * sVar9);
  return;
}

Assistant:

void helper_msa_add_a_h(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->h[0]  = msa_add_a_df(DF_HALF, pws->h[0],  pwt->h[0]);
    pwd->h[1]  = msa_add_a_df(DF_HALF, pws->h[1],  pwt->h[1]);
    pwd->h[2]  = msa_add_a_df(DF_HALF, pws->h[2],  pwt->h[2]);
    pwd->h[3]  = msa_add_a_df(DF_HALF, pws->h[3],  pwt->h[3]);
    pwd->h[4]  = msa_add_a_df(DF_HALF, pws->h[4],  pwt->h[4]);
    pwd->h[5]  = msa_add_a_df(DF_HALF, pws->h[5],  pwt->h[5]);
    pwd->h[6]  = msa_add_a_df(DF_HALF, pws->h[6],  pwt->h[6]);
    pwd->h[7]  = msa_add_a_df(DF_HALF, pws->h[7],  pwt->h[7]);
}